

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O3

void __thiscall uv::Exception::~Exception(Exception *this)

{
  ~Exception(this);
  operator_delete(this);
  return;
}

Assistant:

~Exception() throw() {}